

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          RegSlot homeObj)

{
  bool bVar1;
  undefined1 local_18 [8];
  OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (local_18._0_4_ = value << 0x10, value < 0x10000)) &&
      (local_18._4_2_ = (short)instance, instance < 0x10000)) &&
     ((slotId < 0x10000 &&
      (local_18 = (undefined1  [8])
                  CONCAT26((short)homeObj,
                           (int6)CONCAT62((uint6)local_18._0_6_ >> 0x10,(short)slotId)),
      homeObj < 0x10000)))) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_18,8);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementSlotI3(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, RegSlot homeObj)
    {
        OpLayoutT_ElementSlotI3<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value)
            && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.SlotIndex, slotId)
            && SizePolicy::Assign(layout.HomeObj, homeObj))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }